

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::BootstrapTest_GeneratedFilesMatch_Test::
~BootstrapTest_GeneratedFilesMatch_Test(BootstrapTest_GeneratedFilesMatch_Test *this)

{
  BootstrapTest_GeneratedFilesMatch_Test *this_local;
  
  ~BootstrapTest_GeneratedFilesMatch_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(BootstrapTest, GeneratedFilesMatch) {
  // We need a mapping from the actual file to virtual and actual path
  // of the data to compare to.
  absl::flat_hash_map<absl::string_view, std::string> vpath_map;
  absl::flat_hash_map<absl::string_view, std::string> rpath_map;

  DiskSourceTree source_tree;
  source_tree.MapPath("", TestUtil::TestSourceDir());

  for (auto file_parameter : test_protos) {
    MockErrorCollector error_collector;
    Importer importer(&source_tree, &error_collector);
    const FileDescriptor* file =
        importer.Import(file_parameter[0] + std::string(".proto"));
    ASSERT_TRUE(file != nullptr)
        << "Can't import file " << file_parameter[0] + std::string(".proto")
        << "\n";
    EXPECT_EQ("", error_collector.text_);
    CppGenerator generator;
    MockGeneratorContext context;
#ifdef GOOGLE_PROTOBUF_RUNTIME_INCLUDE_BASE
    generator.set_opensource_runtime(true);
    generator.set_runtime_include_base(GOOGLE_PROTOBUF_RUNTIME_INCLUDE_BASE);
#endif
    std::string error;
    ASSERT_TRUE(generator.Generate(file, file_parameter[1], &context, &error));

    std::string vpath =
        FindWithDefault(vpath_map, file_parameter[0], file_parameter[0]);
    std::string rpath =
        FindWithDefault(rpath_map, file_parameter[0], file_parameter[0]);
    context.ExpectFileMatches(absl::StrCat(vpath, ".pb.cc"),
                              absl::StrCat(rpath, ".pb.cc"));
    context.ExpectFileMatches(absl::StrCat(vpath, ".pb.h"),
                              absl::StrCat(rpath, ".pb.h"));
  }
}